

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brep.hxx
# Opt level: O3

Ref<anurbs::BrepEdge> __thiscall anurbs::Brep::edge(Brep *this,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  pointer pRVar3;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ref<anurbs::BrepEdge> RVar5;
  Ref<anurbs::BrepEdge> RVar6;
  
  lVar2 = *(long *)(index + 0x48);
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RDX * 0x10);
  (this->m_faces).
  super__Vector_base<anurbs::Ref<anurbs::BrepFace>,_std::allocator<anurbs::Ref<anurbs::BrepFace>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + lVar2);
  pRVar3 = *(pointer *)((long)&(_Var4._M_pi)->_M_use_count + lVar2);
  (this->m_faces).
  super__Vector_base<anurbs::Ref<anurbs::BrepFace>,_std::allocator<anurbs::Ref<anurbs::BrepFace>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
  if (pRVar3 != (pointer)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = &(pRVar3->m_entry).
                super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Ref<anurbs::BrepEdge>)
             RVar5.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = &(pRVar3->m_entry).
              super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
  }
  RVar6.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  RVar6.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepEdge>)
         RVar6.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<BrepEdge> Brep::edge(size_t index) const
{
    return m_edges[index];
}